

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbFunc.c
# Opt level: O0

int Acb_FindArgMaxUnderMask(Vec_Wrd_t *vPats,word *Mask,Vec_Int_t *vWeights,int nPats)

{
  int iVar1;
  int nWords_00;
  int iVar2;
  word *pMask;
  word *pPat;
  int CostBest;
  int Cost;
  int iBest;
  int i;
  int nWords;
  int nDivs;
  int nPats_local;
  Vec_Int_t *vWeights_local;
  word *Mask_local;
  Vec_Wrd_t *vPats_local;
  
  iVar1 = Vec_WrdSize(vPats);
  nWords_00 = Abc_Bit6WordNum(nPats);
  CostBest = -1;
  pPat._4_4_ = -1;
  for (Cost = 0; Cost < iVar1 / 0x40; Cost = Cost + 1) {
    pMask = Vec_WrdEntryP(vPats,Cost << 6);
    iVar2 = Abc_TtCountOnesVecMask(Mask,pMask,nWords_00,0);
    if (pPat._4_4_ < iVar2) {
      CostBest = Cost;
      pPat._4_4_ = iVar2;
    }
  }
  return CostBest;
}

Assistant:

int Acb_FindArgMaxUnderMask( Vec_Wrd_t * vPats, word Mask[NWORDS], Vec_Int_t * vWeights, int nPats )
{
    int nDivs = Vec_WrdSize(vPats)/NWORDS;
    int nWords = Abc_Bit6WordNum(nPats);
    int i, iBest = -1;
    int Cost, CostBest = -1;
    for ( i = 0; i < nDivs; i++ )
    {
        word * pPat = Vec_WrdEntryP(vPats, NWORDS*i);
        Cost = Abc_TtCountOnesVecMask(Mask, pPat, nWords, 0);
        if ( CostBest < Cost )
//        if ( CostBest == -1 || (float)CostBest/Cost < 0.6*(float)Vec_IntEntry(vWeights, iBest)/Vec_IntEntry(vWeights, i) )
//        if ( CostBest == -1 || (float)CostBest/Cost < 0.67*(float)Vec_IntEntry(vWeights, iBest)/Vec_IntEntry(vWeights, i) )
        {
            CostBest = Cost;
            iBest = i;
        }
    }
    return iBest;
}